

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilation_context.hpp
# Opt level: O1

uri * __thiscall
jsoncons::jsonschema::
compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
get_base_uri(uri *__return_storage_ptr__,
            compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
            *this)

{
  pointer pcVar1;
  unsigned_long uVar2;
  
  (__return_storage_ptr__->uri_string_)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->uri_string_).field_2;
  pcVar1 = (this->base_uri_).uri_.uri_string_._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,
             pcVar1 + (this->base_uri_).uri_.uri_string_._M_string_length);
  uVar2 = (this->base_uri_).uri_.scheme_part_.second;
  (__return_storage_ptr__->scheme_part_).first = (this->base_uri_).uri_.scheme_part_.first;
  (__return_storage_ptr__->scheme_part_).second = uVar2;
  uVar2 = (this->base_uri_).uri_.userinfo_part_.second;
  (__return_storage_ptr__->userinfo_part_).first = (this->base_uri_).uri_.userinfo_part_.first;
  (__return_storage_ptr__->userinfo_part_).second = uVar2;
  uVar2 = (this->base_uri_).uri_.host_part_.second;
  (__return_storage_ptr__->host_part_).first = (this->base_uri_).uri_.host_part_.first;
  (__return_storage_ptr__->host_part_).second = uVar2;
  uVar2 = (this->base_uri_).uri_.port_part_.second;
  (__return_storage_ptr__->port_part_).first = (this->base_uri_).uri_.port_part_.first;
  (__return_storage_ptr__->port_part_).second = uVar2;
  uVar2 = (this->base_uri_).uri_.path_part_.second;
  (__return_storage_ptr__->path_part_).first = (this->base_uri_).uri_.path_part_.first;
  (__return_storage_ptr__->path_part_).second = uVar2;
  uVar2 = (this->base_uri_).uri_.query_part_.second;
  (__return_storage_ptr__->query_part_).first = (this->base_uri_).uri_.query_part_.first;
  (__return_storage_ptr__->query_part_).second = uVar2;
  uVar2 = (this->base_uri_).uri_.fragment_part_.second;
  (__return_storage_ptr__->fragment_part_).first = (this->base_uri_).uri_.fragment_part_.first;
  (__return_storage_ptr__->fragment_part_).second = uVar2;
  return __return_storage_ptr__;
}

Assistant:

uri get_base_uri() const
        {
            return base_uri_.uri();
        }